

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::
str<kj::StringPtr&,char_const(&)[3],unsigned_int&,char_const(&)[2],unsigned_int&,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,char (*params_1) [3],
          uint *params_2,char (*params_3) [2],uint *params_4,char (*params_5) [3])

{
  ArrayPtr<const_char> *params_5_00;
  CappedArray<char,_14UL> local_90;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  params_5_00 = *(ArrayPtr<const_char> **)this;
  local_58.size_ = strlen((char *)params);
  local_58.ptr = (char *)params;
  _::Stringifier::operator*(&local_90,(Stringifier *)&_::STR,*(uint *)params_1);
  local_68._8_8_ = strlen((char *)params_2);
  local_68._0_8_ = params_2;
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(uint *)params_3);
  local_78._8_8_ = strlen((char *)params_4);
  local_78._0_8_ = params_4;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&stack0xffffffffffffff60,&local_58,
             (ArrayPtr<const_char> *)&local_90,(CappedArray<char,_14UL> *)local_68,
             (ArrayPtr<const_char> *)&local_48,(CappedArray<char,_14UL> *)local_78,params_5_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}